

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_yplus_metric_reference_length
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_DBL reference_length,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_EDGE ref_edge;
  REF_GRID pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_BOOL RVar5;
  REF_INT *vector;
  REF_DBL *vector_00;
  REF_DBL *pRVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  REF_NODE pRVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  REF_INT bc;
  REF_DBL edg_norm [3];
  REF_DBL yplus1;
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  REF_INT local_1cc;
  REF_NODE local_1c8;
  REF_DBL local_1c0;
  REF_DBL *local_1b8;
  double local_1b0;
  REF_GRID local_1a8;
  REF_DBL local_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  REF_DICT local_180;
  REF_DBL local_178;
  double local_170;
  double local_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double dStack_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  REF_DBL local_98;
  double local_90 [5];
  REF_DBL local_68 [7];
  
  pRVar10 = ref_grid->node;
  local_1c0 = mach;
  local_1b8 = (REF_DBL *)temperature;
  local_1a0 = target;
  local_178 = reference_length;
  RVar3 = ref_phys_minspac(re * reference_length,&local_170);
  if (RVar3 == 0) {
    uVar4 = pRVar10->max;
    uVar13 = (ulong)uVar4;
    local_180 = ref_dict_bcs;
    if ((int)uVar4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4a9,
             "ref_phys_yplus_metric_reference_length","malloc hits of REF_INT negative");
      return 1;
    }
    local_1b0 = local_170;
    local_1a8 = ref_grid;
    vector = (REF_INT *)malloc(uVar13 * 4);
    auVar22 = _DAT_0021f120;
    if (vector == (REF_INT *)0x0) {
      pcVar14 = "malloc hits of REF_INT NULL";
      uVar8 = 0x4a9;
    }
    else {
      if (uVar13 != 0) {
        lVar7 = uVar13 - 1;
        auVar19._8_4_ = (int)lVar7;
        auVar19._0_8_ = lVar7;
        auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar19 = auVar19 ^ _DAT_0021f120;
        auVar21 = _DAT_00225510;
        auVar24 = _DAT_0021f110;
        do {
          auVar25 = auVar24 ^ auVar22;
          iVar16 = auVar19._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar16 && auVar19._0_4_ < auVar25._0_4_ ||
                      iVar16 < auVar25._4_4_) & 1)) {
            *(undefined4 *)((long)vector + lVar7) = 0;
          }
          if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
              auVar25._12_4_ <= auVar19._12_4_) {
            *(undefined4 *)((long)vector + lVar7 + 4) = 0;
          }
          auVar25 = auVar21 ^ auVar22;
          iVar26 = auVar25._4_4_;
          if (iVar26 <= iVar16 && (iVar26 != iVar16 || auVar25._0_4_ <= auVar19._0_4_)) {
            *(undefined4 *)((long)vector + lVar7 + 8) = 0;
            *(undefined4 *)((long)vector + lVar7 + 0xc) = 0;
          }
          lVar9 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 4;
          auVar24._8_8_ = lVar9 + 4;
          lVar9 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar9 + 4;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar7);
      }
      local_1c8 = pRVar10;
      vector_00 = (REF_DBL *)malloc(uVar13 * 0x30);
      if (vector_00 == (REF_DBL *)0x0) {
        pcVar14 = "malloc new_log_metric of REF_DBL NULL";
        uVar8 = 0x4aa;
      }
      else {
        if (uVar13 == 0) {
          pRVar6 = (REF_DBL *)malloc(0);
        }
        else {
          memset(vector_00,0,(uVar13 * 6 & 0xffffffff) << 3);
          pRVar6 = (REF_DBL *)calloc(1,uVar13 << 3);
        }
        pRVar2 = local_1a8;
        if (pRVar6 != (REF_DBL *)0x0) {
          uVar4 = ref_phys_yplus_lengthscale
                            (local_1a8,local_1c0,re,(REF_DBL)local_1b8,ldim,field,pRVar6);
          if (uVar4 == 0) {
            if (pRVar2->twod == 0) {
              pcVar14 = "implement 3D";
              uVar4 = 6;
              uVar8 = 0x4ef;
              uVar13 = 6;
              goto LAB_001dfcab;
            }
            ref_cell = pRVar2->cell[0];
            local_1b8 = pRVar6;
            if (0 < ref_cell->max) {
              local_1b0 = local_1b0 / local_178;
              local_1c0 = (REF_DBL)((ulong)local_1c0 & 0xffffffff00000000);
              iVar16 = 0;
              do {
                RVar3 = ref_cell_nodes(ref_cell,iVar16,(REF_INT *)&local_108);
                if (RVar3 == 0) {
                  local_1cc = -1;
                  uVar4 = ref_dict_value(local_180,
                                         *(REF_INT *)
                                          ((long)&local_108 + (long)ref_cell->node_per * 4),
                                         &local_1cc);
                  if ((uVar4 != 0) && (uVar4 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x4b9,"ref_phys_yplus_metric_reference_length",(ulong)uVar4,"bc");
                    local_1c0 = (REF_DBL)CONCAT44(local_1c0._4_4_,uVar4);
                  }
                  if ((uVar4 != 5) && (uVar4 != 0)) {
                    return local_1c0._0_4_;
                  }
                  RVar5 = ref_phys_wall_distance_bc(local_1cc);
                  if (RVar5 != 0) {
                    uVar4 = ref_layer_interior_seg_normal(local_1a8,iVar16,&local_198);
                    if (uVar4 != 0) {
                      pcVar14 = "edge norm";
                      uVar8 = 0x4bb;
                      goto LAB_001dff39;
                    }
                    local_150 = local_198;
                    dStack_148 = dStack_190;
                    local_140 = local_188;
                    lVar7 = (long)(int)local_108;
                    dVar17 = (metric[lVar7 * 6 + 5] * local_188 +
                             metric[lVar7 * 6 + 2] * local_198 + dStack_190 * metric[lVar7 * 6 + 4])
                             * local_188 +
                             (metric[lVar7 * 6 + 2] * local_188 +
                             metric[lVar7 * 6] * local_198 + dStack_190 * metric[lVar7 * 6 + 1]) *
                             local_198 +
                             (metric[lVar7 * 6 + 4] * local_188 +
                             metric[lVar7 * 6 + 1] * local_198 + metric[lVar7 * 6 + 3] * dStack_190)
                             * dStack_190;
                    if (dVar17 < 0.0) {
                      dVar17 = sqrt(dVar17);
                    }
                    else {
                      dVar17 = SQRT(dVar17);
                    }
                    lVar7 = (long)local_108._4_4_;
                    dVar18 = (metric[lVar7 * 6 + 5] * local_188 +
                             metric[lVar7 * 6 + 2] * local_198 + dStack_190 * metric[lVar7 * 6 + 4])
                             * local_188 +
                             (metric[lVar7 * 6 + 2] * local_188 +
                             metric[lVar7 * 6] * local_198 + metric[lVar7 * 6 + 1] * dStack_190) *
                             local_198 +
                             (metric[lVar7 * 6 + 4] * local_188 +
                             metric[lVar7 * 6 + 1] * local_198 + metric[lVar7 * 6 + 3] * dStack_190)
                             * dStack_190;
                    if (dVar18 < 0.0) {
                      dVar18 = sqrt(dVar18);
                    }
                    else {
                      dVar18 = SQRT(dVar18);
                    }
                    lVar7 = (long)(int)local_108;
                    dVar23 = (local_1b8[lVar7] + local_1b8[local_108._4_4_]) * 0.5;
                    dVar20 = dVar23 - local_1b0;
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    if (local_1b0 <= dVar23) {
                      dVar23 = local_1b0;
                    }
                    dVar20 = dVar20 / local_1b0 + -0.1;
                    if (dVar20 <= 0.0) {
                      dVar20 = 0.0;
                    }
                    dVar20 = dVar20 / 0.1;
                    if (1.0 <= dVar20) {
                      dVar20 = 1.0;
                    }
                    dVar17 = dVar20 * (1.0 / ((dVar17 + dVar18) * 0.5)) +
                             (1.0 - dVar20) * ((dVar23 * local_1a0) / 0.866025403784439);
                    local_168 = 1.0 / (dVar17 * dVar17);
                    local_120 = 0;
                    uStack_118 = 0;
                    local_110 = 0x3ff0000000000000;
                    local_158 = 0x3ff0000000000000;
                    local_130 = local_150 - local_140 * 0.0;
                    local_138 = local_140 * 0.0 - dStack_148;
                    local_128 = dStack_148 * 0.0 + local_150 * -0.0;
                    dVar17 = (metric[lVar7 * 6 + 5] * local_128 +
                             local_138 * metric[lVar7 * 6 + 2] + local_130 * metric[lVar7 * 6 + 4])
                             * local_128 +
                             (metric[lVar7 * 6 + 2] * local_128 +
                             metric[lVar7 * 6] * local_138 + local_130 * metric[lVar7 * 6 + 1]) *
                             local_138 +
                             (metric[lVar7 * 6 + 4] * local_128 +
                             metric[lVar7 * 6 + 1] * local_138 + metric[lVar7 * 6 + 3] * local_130)
                             * local_130;
                    if (dVar17 < 0.0) {
                      dVar17 = sqrt(dVar17);
                    }
                    else {
                      dVar17 = SQRT(dVar17);
                    }
                    lVar7 = (long)local_108._4_4_;
                    dVar18 = (metric[lVar7 * 6 + 5] * local_128 +
                             metric[lVar7 * 6 + 2] * local_138 + local_130 * metric[lVar7 * 6 + 4])
                             * local_128 +
                             (metric[lVar7 * 6 + 2] * local_128 +
                             metric[lVar7 * 6] * local_138 + metric[lVar7 * 6 + 1] * local_130) *
                             local_138 +
                             (metric[lVar7 * 6 + 4] * local_128 +
                             metric[lVar7 * 6 + 1] * local_138 + metric[lVar7 * 6 + 3] * local_130)
                             * local_130;
                    if (dVar18 < 0.0) {
                      dVar18 = sqrt(dVar18);
                    }
                    else {
                      dVar18 = SQRT(dVar18);
                    }
                    dVar17 = 1.0 / ((dVar17 + dVar18) * 0.5);
                    local_160 = 1.0 / (dVar17 * dVar17);
                    uVar4 = ref_matrix_form_m(&local_168,local_68);
                    if (uVar4 != 0) {
                      pcVar14 = "form";
                      uVar8 = 0x4e3;
                      goto LAB_001dff39;
                    }
                    uVar4 = ref_matrix_log_m(local_68,&local_98);
                    if (uVar4 != 0) {
                      pcVar14 = "form";
                      uVar8 = 0x4e4;
                      goto LAB_001dff39;
                    }
                    lVar7 = (long)(int)local_108;
                    lVar9 = 0;
                    do {
                      dVar18 = (vector_00 + lVar7 * 6 + lVar9)[1];
                      dVar17 = local_90[lVar9];
                      vector_00[lVar7 * 6 + lVar9] =
                           vector_00[lVar7 * 6 + lVar9] + local_90[lVar9 + -1];
                      (vector_00 + lVar7 * 6 + lVar9)[1] = dVar18 + dVar17;
                      lVar9 = lVar9 + 2;
                    } while (lVar9 != 6);
                    vector[lVar7] = vector[lVar7] + 1;
                    lVar7 = (long)local_108._4_4_;
                    lVar9 = 0;
                    do {
                      dVar18 = (vector_00 + lVar7 * 6 + lVar9)[1];
                      dVar17 = local_90[lVar9];
                      vector_00[lVar7 * 6 + lVar9] =
                           vector_00[lVar7 * 6 + lVar9] + local_90[lVar9 + -1];
                      (vector_00 + lVar7 * 6 + lVar9)[1] = dVar18 + dVar17;
                      lVar9 = lVar9 + 2;
                    } while (lVar9 != 6);
                    vector[lVar7] = vector[lVar7] + 1;
                  }
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < ref_cell->max);
            }
            pRVar10 = local_1c8;
            uVar4 = ref_node_ghost_dbl(local_1c8,vector_00,6);
            if (uVar4 == 0) {
              uVar4 = ref_node_ghost_int(pRVar10,vector,1);
              if (uVar4 == 0) {
                iVar16 = pRVar10->max;
                if (0 < iVar16) {
                  lVar7 = 0;
                  pRVar6 = vector_00;
                  do {
                    if ((-1 < pRVar10->global[lVar7]) && (0 < vector[lVar7])) {
                      auVar22._0_8_ = (double)vector[lVar7];
                      auVar22._8_8_ = auVar22._0_8_;
                      lVar9 = 0;
                      do {
                        auVar21 = divpd(*(undefined1 (*) [16])(pRVar6 + lVar9),auVar22);
                        *(undefined1 (*) [16])(pRVar6 + lVar9) = auVar21;
                        lVar9 = lVar9 + 2;
                      } while (lVar9 != 6);
                      vector[lVar7] = -1;
                      uVar4 = ref_matrix_exp_m(vector_00 + lVar7 * 6,metric + lVar7 * 6);
                      if (uVar4 != 0) {
                        pcVar14 = "form";
                        uVar8 = 0x4fc;
                        goto LAB_001dff39;
                      }
                      iVar16 = local_1c8->max;
                      pRVar10 = local_1c8;
                    }
                    lVar7 = lVar7 + 1;
                    pRVar6 = pRVar6 + 6;
                  } while (lVar7 < iVar16);
                }
                uVar4 = ref_edge_create((REF_EDGE *)&local_108,local_1a8);
                if (uVar4 == 0) {
                  ref_edge = (REF_EDGE)CONCAT44(local_108._4_4_,(int)local_108);
                  if (0 < ref_edge->n) {
                    pRVar1 = ref_edge->e2n;
                    lVar7 = 0;
                    do {
                      iVar16 = pRVar1[lVar7 * 2];
                      lVar11 = (long)iVar16;
                      iVar26 = pRVar1[lVar7 * 2 + 1];
                      lVar9 = (long)iVar26;
                      iVar12 = vector[lVar11];
                      if ((-1 < iVar12) && (vector[lVar9] == -1)) {
                        lVar15 = 0;
                        do {
                          vector_00[lVar11 * 6 + lVar15] =
                               vector_00[iVar26 * 6 + lVar15] + vector_00[lVar11 * 6 + lVar15];
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 6);
                        iVar12 = iVar12 + 1;
                        vector[lVar11] = iVar12;
                      }
                      iVar26 = vector[lVar9];
                      if ((-1 < iVar26) && (iVar12 == -1)) {
                        lVar11 = 0;
                        do {
                          vector_00[lVar9 * 6 + lVar11] =
                               vector_00[iVar16 * 6 + lVar11] + vector_00[lVar9 * 6 + lVar11];
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 6);
                        vector[lVar9] = iVar26 + 1;
                      }
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < ref_edge->n);
                  }
                  ref_edge_free(ref_edge);
                  pRVar10 = local_1c8;
                  uVar4 = ref_node_ghost_dbl(local_1c8,vector_00,6);
                  if (uVar4 == 0) {
                    uVar4 = ref_node_ghost_int(pRVar10,vector,1);
                    if (uVar4 == 0) {
                      iVar16 = pRVar10->max;
                      if (0 < iVar16) {
                        lVar7 = 0;
                        pRVar6 = vector_00;
                        do {
                          if ((-1 < pRVar10->global[lVar7]) && (0 < vector[lVar7])) {
                            auVar25._0_8_ = (double)vector[lVar7];
                            auVar25._8_8_ = auVar25._0_8_;
                            lVar9 = 0;
                            do {
                              auVar22 = divpd(*(undefined1 (*) [16])(pRVar6 + lVar9),auVar25);
                              *(undefined1 (*) [16])(pRVar6 + lVar9) = auVar22;
                              lVar9 = lVar9 + 2;
                            } while (lVar9 != 6);
                            vector[lVar7] = -2;
                            uVar4 = ref_matrix_exp_m(vector_00 + lVar7 * 6,metric + lVar7 * 6);
                            if (uVar4 != 0) {
                              pcVar14 = "form";
                              uVar8 = 0x521;
                              goto LAB_001dff39;
                            }
                            iVar16 = local_1c8->max;
                            pRVar10 = local_1c8;
                          }
                          lVar7 = lVar7 + 1;
                          pRVar6 = pRVar6 + 6;
                        } while (lVar7 < iVar16);
                      }
                      uVar4 = ref_node_ghost_dbl(pRVar10,metric,6);
                      if (uVar4 == 0) {
                        free(local_1b8);
                        free(vector_00);
                        free(vector);
                        return 0;
                      }
                      pcVar14 = "ghost metric";
                      uVar8 = 0x525;
                    }
                    else {
                      pcVar14 = "ghost hits";
                      uVar8 = 0x518;
                    }
                  }
                  else {
                    pcVar14 = "ghost metric";
                    uVar8 = 0x517;
                  }
                }
                else {
                  pcVar14 = "orig edges";
                  uVar8 = 0x503;
                }
              }
              else {
                pcVar14 = "ghost hits";
                uVar8 = 0x4f3;
              }
            }
            else {
              pcVar14 = "ghost metric";
              uVar8 = 0x4f2;
            }
          }
          else {
            pcVar14 = "length scale";
            uVar8 = 0x4ae;
          }
LAB_001dff39:
          uVar13 = (ulong)uVar4;
          goto LAB_001dfcab;
        }
        pcVar14 = "malloc lengthscale of REF_DBL NULL";
        uVar8 = 0x4ab;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar8,
           "ref_phys_yplus_metric_reference_length",pcVar14);
    uVar4 = 2;
  }
  else {
    pcVar14 = "minspac";
    uVar4 = 1;
    uVar8 = 0x4a6;
    uVar13 = 1;
LAB_001dfcab:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar8,
           "ref_phys_yplus_metric_reference_length",uVar13,pcVar14);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric_reference_length(
    REF_GRID ref_grid, REF_DBL *metric, REF_DBL mach, REF_DBL re,
    REF_DBL temperature, REF_DBL target, REF_DBL reference_length, REF_INT ldim,
    REF_DBL *field, REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  REF_DBL reynolds_number, reference_lengthscale, yplus1;
  REF_DBL equilateral_altitude =
      0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */

  reynolds_number = re * reference_length;
  RSS(ref_phys_minspac(reynolds_number, &yplus1), "minspac");
  reference_lengthscale = yplus1 / reference_length;

  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], h, mh, l0, diff, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;

      l0 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);

      diff = ABS(l0 - reference_lengthscale) / reference_lengthscale;

      h0 = target * MIN(l0, reference_lengthscale) / equilateral_altitude;
      {
        REF_DBL st, sr;
        sr = MIN(MAX(diff - 0.1, 0.0) / 0.1, 1.0);
        st = 1.0 - sr;
        h = st * h0 + sr * mh;
        /*
        printf("x %.2f l0 %0.5e ref %0.5e diff %.2f sr %.2f st %.2f\n",
               ref_node_xyz(ref_node, 0, edg_nodes[0]), l0,
               reference_lengthscale, diff, sr, st);
        */
      }
      ref_matrix_eig(d, 0) = 1.0 / (h * h);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}